

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::UnaryConditionalDirectiveExpressionSyntax::setChild
          (UnaryConditionalDirectiveExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  Token TVar2;
  
  if (index == 0) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->op).kind = TVar2.kind;
    (this->op).field_0x2 = TVar2._2_1_;
    (this->op).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->op).rawLen = TVar2.rawLen;
    (this->op).info = TVar2.info;
  }
  else {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->operand).ptr = (ConditionalDirectiveExpressionSyntax *)pSVar1;
  }
  return;
}

Assistant:

void UnaryConditionalDirectiveExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: op = child.token(); return;
        case 1: operand = child.node() ? &child.node()->as<ConditionalDirectiveExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}